

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map)

{
  undefined8 *in_RDI;
  SUNErrCode err;
  undefined4 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = SUNStlVector_SUNHashMapKeyValue_Destroy((SUNStlVector_SUNHashMapKeyValue *)map);
    if (local_4 == 0) {
      free((void *)*in_RDI);
      *in_RDI = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map)
{
  if (map == NULL) { return SUN_SUCCESS; }

  SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_Destroy(&(*map)->buckets);
  if (err) { return err; }
  free(*map);
  *map = NULL;

  return SUN_SUCCESS;
}